

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall
Equality_componentNotEqualByReset_Test::TestBody(Equality_componentNotEqualByReset_Test *this)

{
  byte bVar1;
  AssertHelper local_90 [8];
  Message local_88 [8];
  AssertionResult local_80 [2];
  ComponentPtr c2;
  ComponentPtr c1;
  ResetPtr r2;
  ResetPtr r1;
  AssertionResult gtest_ar_;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"c",(allocator<char> *)&c2);
  libcellml::Component::create((string *)&c1);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"c",(allocator<char> *)&r1);
  libcellml::Component::create((string *)&c2);
  std::__cxx11::string::~string((string *)local_80);
  libcellml::Reset::create();
  libcellml::Reset::create();
  libcellml::Reset::setOrder
            ((int)r1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Reset::setOrder
            ((int)r2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addReset
            ((shared_ptr *)
             c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addReset
            ((shared_ptr *)
             c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Component,void>
            ((__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> *)local_80,
             &c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = libcellml::Entity::equals
                    ((shared_ptr *)
                     c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80[0].message_);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_80,&gtest_ar_.success_,"c1->equals(c2)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x2d2,(char *)local_80[0]._0_8_);
    testing::internal::AssertHelper::operator=(local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Component,void>
            ((__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> *)local_80,
             &c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = libcellml::Entity::equals
                    ((shared_ptr *)
                     c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80[0].message_);
  if (bVar1 != 0) {
    testing::Message::Message(local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_80,&gtest_ar_.success_,"c2->equals(c1)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x2d3,(char *)local_80[0]._0_8_);
    testing::internal::AssertHelper::operator=(local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r1.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Equality, componentNotEqualByReset)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create("c");
    libcellml::ComponentPtr c2 = libcellml::Component::create("c");

    libcellml::ResetPtr r1 = libcellml::Reset::create();
    libcellml::ResetPtr r2 = libcellml::Reset::create();

    r1->setOrder(5);
    r2->setOrder(7);

    c1->addReset(r1);
    c2->addReset(r2);

    EXPECT_FALSE(c1->equals(c2));
    EXPECT_FALSE(c2->equals(c1));
}